

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O3

void Io_WriteBlif(Abc_Ntk_t *pNtk,char *FileName,int fWriteLatches,int fBb2Wb,int fSeq)

{
  char *pcVar1;
  Abc_Ntk_t *pNtk_00;
  FILE *__stream;
  char *pcVar2;
  Abc_Des_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x59,"void Io_WriteBlif(Abc_Ntk_t *, char *, int, int, int)");
  }
  __stream = fopen(FileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = pNtk->pName;
    pcVar2 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar2);
    Io_NtkWrite((FILE *)__stream,pNtk,fWriteLatches,fBb2Wb,fSeq);
    if ((0 < pNtk->nObjCounts[10]) || (0 < pNtk->nObjCounts[9])) {
      pAVar3 = pNtk->pDesign;
      pVVar4 = pAVar3->vModules;
      if (0 < pVVar4->nSize) {
        lVar5 = 0;
        do {
          pNtk_00 = (Abc_Ntk_t *)pVVar4->pArray[lVar5];
          if (pNtk_00 != pNtk) {
            fwrite("\n\n",2,1,__stream);
            Io_NtkWrite((FILE *)__stream,pNtk_00,fWriteLatches,fBb2Wb,fSeq);
            pAVar3 = pNtk->pDesign;
          }
          lVar5 = lVar5 + 1;
          pVVar4 = pAVar3->vModules;
        } while (lVar5 < pVVar4->nSize);
      }
    }
    fclose(__stream);
    return;
  }
  fwrite("Io_WriteBlif(): Cannot open the output file.\n",0x2d,1,_stdout);
  return;
}

Assistant:

void Io_WriteBlif( Abc_Ntk_t * pNtk, char * FileName, int fWriteLatches, int fBb2Wb, int fSeq )
{
    FILE * pFile;
    Abc_Ntk_t * pNtkTemp;
    int i;
    assert( Abc_NtkIsNetlist(pNtk) );
    // start writing the file
    pFile = fopen( FileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBlif(): Cannot open the output file.\n" );
        return;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    // write the master network
    Io_NtkWrite( pFile, pNtk, fWriteLatches, fBb2Wb, fSeq );
    // make sure there is no logic hierarchy
//    assert( Abc_NtkWhiteboxNum(pNtk) == 0 );
    // write the hierarchy if present
    if ( Abc_NtkBlackboxNum(pNtk) > 0 || Abc_NtkWhiteboxNum(pNtk) > 0 )
    {
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pNtkTemp, i )
        {
            if ( pNtkTemp == pNtk )
                continue;
            fprintf( pFile, "\n\n" );
            Io_NtkWrite( pFile, pNtkTemp, fWriteLatches, fBb2Wb, fSeq );
        }
    }
    fclose( pFile );
}